

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar8 = 0;
  uVar13 = 0;
  lVar6 = 0;
  do {
    if (uVar8 == count + 0x3f >> 6) {
      return count - lVar6;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar14 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar14 = count;
      }
LAB_013b5ad7:
      lVar12 = uVar13 * 4 + 2;
      for (; uVar10 = uVar13, uVar13 < uVar14; uVar13 = uVar13 + 1) {
        uVar9 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar13];
        }
        lVar2 = *(long *)((long)ldata + lVar12 * 4 + -8);
        lVar3 = *(long *)((long)&ldata->lower + lVar12 * 4);
        lVar4 = *(long *)((long)rdata + lVar12 * 4 + -8);
        lVar5 = *(long *)((long)&rdata->lower + lVar12 * 4);
        false_sel->sel_vector[lVar6] = (sel_t)uVar9;
        lVar6 = lVar6 + (ulong)(lVar3 != lVar5 || lVar2 != lVar4);
        lVar12 = lVar12 + 4;
      }
    }
    else {
      uVar9 = puVar1[uVar8];
      uVar14 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar14 = count;
      }
      if (uVar9 == 0xffffffffffffffff) goto LAB_013b5ad7;
      if (uVar9 == 0) {
        for (; uVar10 = uVar14, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          uVar9 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar13];
          }
          false_sel->sel_vector[lVar6] = (sel_t)uVar9;
          lVar6 = lVar6 + 1;
        }
      }
      else {
        lVar12 = uVar13 * 4 + 2;
        uVar7 = 0;
        for (; uVar10 = uVar13, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)sel->sel_vector[uVar13];
          }
          uVar11 = 1;
          if ((uVar9 >> (uVar7 & 0x3f) & 1) != 0) {
            uVar11 = (ulong)(*(long *)((long)&ldata->lower + lVar12 * 4) !=
                             *(long *)((long)&rdata->lower + lVar12 * 4) ||
                            *(long *)((long)ldata + lVar12 * 4 + -8) !=
                            *(long *)((long)rdata + lVar12 * 4 + -8));
          }
          false_sel->sel_vector[lVar6] = (sel_t)uVar10;
          lVar6 = lVar6 + uVar11;
          uVar7 = uVar7 + 1;
          lVar12 = lVar12 + 4;
        }
      }
    }
    uVar13 = uVar10;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}